

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O2

void m2v_multadd_row_from(m2v *M1,int r1,int offs,int alpha,m2v *Mt,int rt)

{
  uint *puVar1;
  int iVar2;
  m2v_base *pmVar3;
  m2v_base *pmVar4;
  int iVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  
  if (alpha != 0) {
    lVar7 = (long)r1 * (long)M1->row_stride;
    iVar5 = offs / 0x20;
    lVar8 = (long)Mt->row_stride * (long)rt;
    pmVar3 = M1->e;
    pmVar4 = Mt->e;
    puVar6 = pmVar4 + ((int)lVar8 + iVar5);
    *puVar6 = *puVar6 ^ (pmVar3[(int)lVar7 + iVar5] >> ((byte)offs & 0x1f)) << ((byte)offs & 0x1f);
    iVar2 = Mt->row_stride;
    puVar6 = pmVar3 + lVar7 + iVar5;
    lVar8 = iVar5 + lVar8;
    while( true ) {
      lVar8 = lVar8 + 1;
      puVar6 = puVar6 + 1;
      if ((long)iVar2 * ((long)rt + 1) <= lVar8) break;
      puVar1 = pmVar4 + lVar8;
      *puVar1 = *puVar1 ^ *puVar6;
    }
  }
  return;
}

Assistant:

void m2v_multadd_row_from(const m2v* M1,
			int r1,
			int offs,
			int alpha,
			m2v* Mt,
			int rt)
{
	assert(M1->n_col == Mt->n_col);
	assert(0 <= r1 && r1 < M1->n_row);
	assert(0 <= rt && rt < Mt->n_row);
	if (alpha == 0)
		return;

	int o1 = get_word(M1, r1, offs);
	int ot = get_word(Mt, rt, offs);
	/* multadd first partial word */
	{
		const m2v_base m = ~(get_mask(get_bit(Mt, offs)) - 1);
		Mt->e[ot++] ^= M1->e[o1++] & m;
	}

	/* loop over remaining complete words */
	const int oe = get_word(Mt, rt + 1, 0);
	while (ot < oe) {
		Mt->e[ot++] ^= M1->e[o1++];
	}
}